

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O3

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createTestQuadMosaic
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,VkImageViewType viewType)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int quadNdx;
  float *pfVar4;
  long lVar5;
  size_t quadNdx_1;
  long lVar6;
  pointer pVVar7;
  undefined1 auVar8 [16];
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> vertices;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> local_28;
  long lVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(viewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_2D:
    createFullscreenQuad();
    goto LAB_0049a0c1;
  case VK_IMAGE_VIEW_TYPE_3D:
    createQuadMosaic(&local_28,2,3);
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((long)local_28.
              super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_28.
              super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_28.
                    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_28.
                    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pfVar4 = ((local_28.
                 super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                 ._M_impl.super__Vector_impl_data._M_start)->texCoord).m_data + 2;
      do {
        *pfVar4 = *pfVar4 / 5.0 + -0.001;
        pfVar4 = pfVar4 + 8;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    createQuadMosaicCube();
    goto LAB_0049a0c1;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    createQuadMosaic(&local_28,2,3);
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auVar3 = _DAT_00ac4b80;
    auVar2 = _DAT_00ac4b30;
    lVar5 = 0;
    do {
      lVar6 = 0x34;
      auVar8 = auVar2;
      do {
        if (SUB164(auVar8 ^ auVar3,4) == -0x80000000 && SUB164(auVar8 ^ auVar3,0) < -0x7ffffffa) {
          *(float *)((long)local_28.
                           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].position.m_data + lVar6) =
               (float)lVar5;
          *(float *)((long)((local_28.
                             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                             ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar6) =
               (float)lVar5;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar6 = lVar6 + 0x40;
      } while (lVar6 != 0xf4);
      lVar5 = lVar5 + 1;
      local_28.
      super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_28.
           super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           ._M_impl.super__Vector_impl_data._M_start + 6;
    } while (lVar5 != 6);
    break;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    createQuadMosaic(&local_28,2,3);
LAB_0049a0c1:
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    createQuadMosaicCube();
    lVar5 = 0;
    pVVar7 = local_28.
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = (&DAT_00addd70)[lVar5];
      lVar6 = 0;
      do {
        lVar9 = lVar6;
        *(float *)((long)(pVVar7->texCoord).m_data + lVar9 + 0xc) = (float)iVar1;
        lVar6 = lVar9 + 0x20;
      } while ((int)(lVar9 + 0x20) != 0xc0);
      lVar5 = lVar5 + 1;
      pVVar7 = (pointer)((long)pVVar7[1].position.m_data + lVar9);
    } while (lVar5 != 6);
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28.
         super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createTestQuadMosaic (vk::VkImageViewType viewType)
{
	std::vector<Vertex4Tex4> vertices;

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
			vertices = createFullscreenQuad();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			vertices = createQuadMosaic(2, 3);

			// Set up array indices
			for (size_t quadNdx = 0; quadNdx < 6; quadNdx++)
				for (size_t vertexNdx = 0; vertexNdx < 6; vertexNdx++)
					vertices[quadNdx * 6 + vertexNdx].texCoord.y() = (float)quadNdx;

			break;

		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			vertices = createQuadMosaic(2, 3);
			break;

		case vk::VK_IMAGE_VIEW_TYPE_3D:
			vertices = createQuadMosaic(2, 3);

			// Use z between 0.0 and 1.0.
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
			{
				vertices[vertexNdx].texCoord.z() /= 5.0f;
				vertices[vertexNdx].texCoord.z() -= 0.001f; // Substract small value to correct floating-point errors at the boundaries between slices
			}

			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
			vertices = createQuadMosaicCube();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			{
				int faceArrayIndices[6] = { 0, 1, 2, 3, 4, 5 };
				vertices = createQuadMosaicCubeArray(faceArrayIndices);
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return vertices;
}